

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O1

float __thiscall slang::SVInt::toFloat(SVInt *this)

{
  uint uVar1;
  byte bVar2;
  logic_t lVar3;
  bitwidth_t bVar4;
  _Storage<unsigned_long,_true> _Var5;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aVar6;
  char cVar7;
  uint uVar8;
  bool bVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  optional<long> oVar14;
  optional<unsigned_long> oVar15;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_38;
  uint local_30;
  char local_2c;
  byte local_2b;
  float local_24;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_20;
  uint local_18;
  byte local_13;
  
  SVInt((SVInt *)&local_38,&this->super_SVIntStorage);
  if (local_2b == 1) {
    flattenUnknowns((SVInt *)&local_38);
  }
  if (local_2c == '\x01') {
    oVar14 = as<long>((SVInt *)&local_38);
    if (((undefined1  [16])
         oVar14.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
        & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      local_24 = (float)oVar14.super__Optional_base<long,_true,_true>._M_payload.
                        super__Optional_payload_base<long>._M_payload;
      goto LAB_001b6243;
    }
  }
  else {
    oVar15 = as<unsigned_long>((SVInt *)&local_38);
    _Var5._M_value =
         oVar15.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    if ((long)_Var5._M_value < 0) {
      local_24 = (float)((ulong)(oVar15.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                                 super__Optional_payload_base<unsigned_long>._M_payload._0_4_ & 1) |
                        _Var5._M_value >> 1);
      local_24 = local_24 + local_24;
    }
    else {
      local_24 = (float)(long)_Var5._M_value;
    }
    if (((undefined1  [16])
         oVar15.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) !=
        (undefined1  [16])0x0) goto LAB_001b6243;
  }
  if (local_2c == '\x01') {
    lVar3 = operator[]((SVInt *)&local_38,local_30 - 1);
    bVar9 = (lVar3.value & 0x7f) != 0 && lVar3.value != '@';
  }
  else {
    bVar9 = false;
  }
  if (bVar9) {
    operator-((SVInt *)&local_20);
    operator=((SVInt *)&local_38,(SVInt *)&local_20);
    if (((0x40 < local_18) || ((local_13 & 1) != 0)) && ((void *)local_20.val != (void *)0x0)) {
      operator_delete__(local_20.pVal);
    }
  }
  bVar4 = getActiveBits((SVInt *)&local_38);
  uVar1 = bVar4 - 1;
  uVar11 = uVar1 >> 6;
  uVar8 = 0x40;
  if ((bVar4 & 0x3f) != 0) {
    uVar8 = bVar4 & 0x3f;
  }
  aVar6.pVal = (uint64_t *)&local_38;
  if ((local_2b & 1) != 0) {
    aVar6 = local_38;
  }
  if (0x40 < local_30) {
    aVar6 = local_38;
  }
  uVar10 = aVar6.pVal[uVar11];
  cVar7 = (char)uVar8;
  if (uVar1 < 0x40 || 0x17 < uVar8) {
    if (uVar8 < 0x19) {
      uVar13 = 1;
      uVar12 = 0;
    }
    else {
      uVar12 = ~(-1L << (cVar7 - 0x18U & 0x3f)) & uVar10;
      uVar13 = 1L << (cVar7 - 0x19U & 0x3f);
      uVar10 = uVar10 >> (cVar7 - 0x18U & 0x3f);
    }
  }
  else {
    uVar11 = uVar11 - 1;
    bVar2 = cVar7 + 0x28U & 0x3f;
    uVar10 = aVar6.pVal[uVar11] >> bVar2 | uVar10 << 0x40 - bVar2;
    uVar12 = ~(-1L << (cVar7 + 0x28U & 0x3f)) & aVar6.pVal[uVar11];
    uVar13 = 1L << (cVar7 + 0x27U & 0x3f);
  }
  if (uVar13 < uVar12) {
LAB_001b61bc:
    uVar10 = uVar10 + 1;
  }
  else if (uVar12 == uVar13) {
    if ((uVar10 & 1) != 0) goto LAB_001b61bc;
    if (uVar11 != 0) {
      aVar6.pVal = (uint64_t *)&local_38;
      if ((local_2b & 1) != 0) {
        aVar6 = local_38;
      }
      if (0x40 < local_30) {
        aVar6 = local_38;
      }
      uVar10 = uVar10 | aVar6.pVal[uVar11 - 1] != 0;
    }
  }
  uVar12 = (ulong)(uVar10 == 0x1000000) + (ulong)uVar1;
  if (uVar12 < 0x80) {
    local_24 = (float)((uint)uVar10 & 0x7fffff |
                      (uint)bVar9 << 0x1f | (int)uVar12 * 0x800000 + 0x3f800000U);
  }
  else if (bVar9) {
    local_24 = -INFINITY;
  }
  else {
    local_24 = INFINITY;
  }
LAB_001b6243:
  if (((0x40 < local_30) || ((local_2b & 1) != 0)) &&
     ((undefined1 *)local_38.val != (undefined1 *)0x0)) {
    operator_delete__(local_38.pVal);
  }
  return local_24;
}

Assistant:

float SVInt::toFloat() const {
    return toIEEE754<float, 8, 23, 127>(*this);
}